

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFileCreation.cpp
# Opt level: O1

uint32_t c_symlink2(LinkedObjectFile *f,vector<unsigned_char,_std::allocator<unsigned_char>_> *data,
                   uint32_t code_ptr_offset,uint32_t link_ptr_offset,SymbolLinkKind kind,char *name,
                   int seg_id)

{
  uint32_t *puVar1;
  byte bVar2;
  uint uVar3;
  pointer puVar4;
  uint3 uVar5;
  TypeInfo *pTVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  Kind kind_00;
  ulong uVar10;
  allocator local_61;
  uint32_t local_60;
  SymbolLinkKind local_5c;
  char *local_58;
  string local_50;
  
  local_60 = code_ptr_offset;
  local_5c = kind;
  pTVar6 = get_type_info();
  local_58 = name;
  std::__cxx11::string::string((string *)&local_50,name,&local_61);
  TypeInfo::inform_symbol_with_no_type_info(pTVar6,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  uVar10 = (ulong)local_60;
  while( true ) {
    uVar8 = (ulong)link_ptr_offset;
    puVar4 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar4;
    if (uVar7 <= uVar8) break;
    bVar2 = puVar4[uVar8];
    uVar9 = (uint)bVar2;
    if ((bVar2 & 3) == 0) {
      link_ptr_offset = link_ptr_offset + 1;
    }
    else {
      uVar9 = (uint)CONCAT11(puVar4[uVar8 + 1],bVar2);
      if ((bVar2 & 2) == 0) {
        link_ptr_offset = link_ptr_offset + 2;
      }
      else {
        uVar5 = CONCAT12(puVar4[uVar8 + 2],CONCAT11(puVar4[uVar8 + 1],bVar2));
        uVar9 = (uint)uVar5;
        if ((bVar2 & 1) == 0) {
          link_ptr_offset = link_ptr_offset + 3;
        }
        else {
          uVar9 = CONCAT13(puVar4[uVar8 + 3],uVar5);
          link_ptr_offset = link_ptr_offset + 4;
        }
      }
    }
    puVar1 = &(f->stats).total_v2_symbol_links;
    *puVar1 = *puVar1 + 1;
    uVar9 = (int)uVar10 + (uVar9 & 0xfffffffc);
    uVar10 = (ulong)uVar9;
    uVar8 = uVar10;
    if (uVar7 <= uVar10) break;
    uVar3 = *(uint *)(puVar4 + uVar10);
    if (uVar3 == 0xffffffff) {
      if (local_5c == SYMBOL) {
        kind_00 = SYM_PTR;
      }
      else if (local_5c == TYPE) {
        pTVar6 = get_type_info();
        std::__cxx11::string::string((string *)&local_50,local_58,&local_61);
        TypeInfo::inform_type(pTVar6,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        kind_00 = TYPE_PTR;
      }
      else {
        kind_00 = EMPTY_PTR;
      }
      LinkedObjectFile::symbol_link_word(f,seg_id,uVar9 - local_60,local_58,kind_00);
    }
    else {
      if (((short)uVar3 != 0) && ((uVar3 & 0xffff) != 0xffff)) {
        __assert_fail("(code_value & 0xffff) == 0 || (code_value & 0xffff) == 0xffff",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x90,
                      "uint32_t c_symlink2(LinkedObjectFile &, const std::vector<uint8_t> &, uint32_t, uint32_t, SymbolLinkKind, const char *, int)"
                     );
      }
      if (local_5c != SYMBOL) {
        __assert_fail("kind == SymbolLinkKind::SYMBOL",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x91,
                      "uint32_t c_symlink2(LinkedObjectFile &, const std::vector<uint8_t> &, uint32_t, uint32_t, SymbolLinkKind, const char *, int)"
                     );
      }
      LinkedObjectFile::symbol_link_offset(f,seg_id,uVar9 - local_60,local_58);
    }
    uVar8 = (ulong)link_ptr_offset;
    puVar4 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar4) <= uVar8) break;
    if (puVar4[uVar8] == '\0') {
      return link_ptr_offset + 1;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8);
}

Assistant:

static uint32_t c_symlink2(LinkedObjectFile& f,
                           const std::vector<uint8_t>& data,
                           uint32_t code_ptr_offset,
                           uint32_t link_ptr_offset,
                           SymbolLinkKind kind,
                           const char* name,
                           int seg_id) {
  get_type_info().inform_symbol_with_no_type_info(name);
  auto initial_offset = code_ptr_offset;
  do {
    auto table_value = data.at(link_ptr_offset);
    const uint8_t* relocPtr = &data.at(link_ptr_offset);

    // link table has a series of variable-length-encoded integers indicating the seek amount to hit
    // each reference to the symbol.  It ends when the seek is 0, and all references to this symbol
    // have been patched.
    uint32_t seek = table_value;
    uint32_t next_reloc = link_ptr_offset + 1;

    if (seek & 3) {
      seek = (relocPtr[1] << 8) | table_value;
      next_reloc = link_ptr_offset + 2;
      if (seek & 2) {
        seek = (relocPtr[2] << 16) | seek;
        next_reloc = link_ptr_offset + 3;
        if (seek & 1) {
          seek = (relocPtr[3] << 24) | seek;
          next_reloc = link_ptr_offset + 4;
        }
      }
    }

    f.stats.total_v2_symbol_links++;
    link_ptr_offset = next_reloc;

    code_ptr_offset += (seek & 0xfffffffc);

    // the value of the code gives us more information
    uint32_t code_value = *(const uint32_t*)(&data.at(code_ptr_offset));
    if (code_value == 0xffffffff) {
      // absolute link - replace entire word with a pointer.
      LinkedWord::Kind word_kind;
      switch (kind) {
        case SymbolLinkKind::SYMBOL:
          word_kind = LinkedWord::SYM_PTR;
          break;
        case SymbolLinkKind::EMPTY_LIST:
          word_kind = LinkedWord::EMPTY_PTR;
          break;
        case SymbolLinkKind::TYPE:
          get_type_info().inform_type(name);
          word_kind = LinkedWord::TYPE_PTR;
          break;
        default:
          throw std::runtime_error("unhandled SymbolLinkKind");
      }

      f.symbol_link_word(seg_id, code_ptr_offset - initial_offset, name, word_kind);
    } else {
      // offset link - replace lower 16 bits with symbol table offset.

      assert((code_value & 0xffff) == 0 || (code_value & 0xffff) == 0xffff);
      assert(kind == SymbolLinkKind::SYMBOL);
      //      assert(false); // this case does not occur in V2/V4.  It does in V3.
      f.symbol_link_offset(seg_id, code_ptr_offset - initial_offset, name);
    }

  } while (data.at(link_ptr_offset));

  // seek past terminating 0.
  return link_ptr_offset + 1;
}